

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteHeader(BinaryWriter *this,char *name,int index)

{
  Stream *this_00;
  
  this_00 = this->stream_->log_stream_;
  if (this_00 == (Stream *)0x0) {
    return;
  }
  if (index != -1) {
    Stream::Writef(this_00,"; %s %d\n",name);
    return;
  }
  Stream::Writef(this_00,"; %s\n",name);
  return;
}

Assistant:

void BinaryWriter::WriteHeader(const char* name, int index) {
  if (stream_->has_log_stream()) {
    if (index == PRINT_HEADER_NO_INDEX) {
      stream_->log_stream().Writef("; %s\n", name);
    } else {
      stream_->log_stream().Writef("; %s %d\n", name, index);
    }
  }
}